

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::DragIntN(char *label,int *v,int components,float v_speed,int v_min,int v_max,
                    char *display_format)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  char *text_end;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float w_full;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  uVar4 = 0;
  if (pIVar1->SkipItems == false) {
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,w_full);
    uVar5 = (ulong)(uint)components;
    if (components < 1) {
      uVar5 = uVar4;
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      PushID((int)uVar6);
      bVar3 = DragInt("##v",v,v_speed,v_min,v_max,display_format);
      uVar4 = (ulong)(byte)((byte)uVar4 | bVar3);
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      PopID();
      PopItemWidth();
      v = v + 1;
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
  }
  return SUB81(uVar4,0);
}

Assistant:

bool ImGui::DragIntN(const char* label, int* v, int components, float v_speed, int v_min, int v_max, const char* display_format)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= DragInt("##v", &v[i], v_speed, v_min, v_max, display_format);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}